

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

ptr<asio_service> nuraft::nuraft_global_mgr::get_asio_service(void)

{
  _func_int **pp_Var1;
  int iVar2;
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  ptr<asio_service> pVar4;
  
  __mutex = (pthread_mutex_t *)get_instance();
  if (__mutex == (pthread_mutex_t *)0x0) {
    (in_RDI->super_delayed_task_scheduler)._vptr_delayed_task_scheduler = (_func_int **)0x0;
    (in_RDI->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    (in_RDI->super_delayed_task_scheduler)._vptr_delayed_task_scheduler =
         (_func_int **)__mutex[1].__align;
    pp_Var1 = *(_func_int ***)((long)__mutex + 0x30);
    (in_RDI->super_rpc_client_factory)._vptr_rpc_client_factory = pp_Var1;
    if (pp_Var1 != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      }
    }
    pthread_mutex_unlock(__mutex);
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<asio_service>)
         pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::get_asio_service() {
    // NOTE:
    //   Basic assumption is that this function is not called frequently,
    //   only once at the initialization time. Hence it is ok to acquire
    //   lock for a such read-only operation.
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    return mgr->asio_service_;
}